

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-base.h
# Opt level: O0

string * __thiscall
mp::BasicSolver::GetOptionFile_abi_cxx11_(BasicSolver *this,SolverOption *param_2)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x198));
  return in_RDI;
}

Assistant:

std::string GetOptionFile(const SolverOption &) const
  { return option_file_save_; }